

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.c
# Opt level: O2

int main(void)

{
  undefined1 *puVar1;
  pid_t pVar2;
  _Bool _Var3;
  int iVar4;
  __pid_t _Var5;
  uint uVar6;
  uint *puVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  FILE *pFVar11;
  bool halt;
  undefined8 uStack_440;
  undefined1 local_438 [8];
  tester_mq_msg tester_msg;
  int wait_ret;
  
  uStack_440 = (code *)0x1012c5;
  main_pid = getpid();
  uStack_440 = (code *)0x1012d7;
  iVar4 = sigemptyset((sigset_t *)&err_action.sa_mask);
  if (iVar4 == -1) {
LAB_001013b1:
    err = true;
    uStack_440 = (code *)0x1013d4;
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                  ,"setup_sig_handlers");
  }
  else {
    err_action.sa_flags = 0;
    err_action.__sigaction_handler.sa_handler = sig_err_handler;
    uStack_440 = (code *)0x101306;
    iVar4 = sigaction(2,(sigaction *)&err_action,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_001013b1;
    uStack_440 = (code *)0x101320;
    iVar4 = sigaction(0xf,(sigaction *)&err_action,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_001013b1;
    uStack_440 = (code *)0x101335;
    iVar4 = sigemptyset((sigset_t *)&snt_success_action.sa_mask);
    if (iVar4 == -1) goto LAB_001013b1;
    snt_success_action.sa_flags = 0x10000000;
    snt_success_action.__sigaction_handler.sa_handler = sig_snt_success_handler;
    uStack_440 = (code *)0x10135e;
    iVar4 = __libc_current_sigrtmin();
    uStack_440 = (code *)0x10136b;
    iVar4 = sigaction(iVar4 + 1,(sigaction *)&snt_success_action,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_001013b1;
    uStack_440 = (code *)0x10137c;
    iVar4 = sigemptyset((sigset_t *)&rcd_complete_action.sa_mask);
    if (iVar4 == -1) goto LAB_001013b1;
    rcd_complete_action.sa_flags = 0;
    rcd_complete_action.__sigaction_handler.sa_handler = sig_rcd_complete_handler;
    uStack_440 = (code *)0x10139b;
    iVar4 = __libc_current_sigrtmin();
    uStack_440 = (code *)0x1013ac;
    iVar4 = sigaction(iVar4 + 2,(sigaction *)&snt_success_action,(sigaction *)0x0);
    if (iVar4 == -1) goto LAB_001013b1;
  }
  if (err != true) {
    uStack_440 = (code *)0x1013f6;
    tester_mq_get_name_from_pid(main_pid,tester_mq_name);
    uStack_440 = (code *)0x101408;
    tester_mq = tester_mq_start(true,tester_mq_name,&err);
    pFVar11 = _stderr;
    if (err == true) {
      uStack_440 = (code *)0x1016ce;
      puVar7 = (uint *)__errno_location();
      uVar6 = *puVar7;
      uStack_440 = (code *)0x1016d9;
      pcVar8 = strerror(uVar6);
      pcVar10 = "Failed to start tester mq";
      goto LAB_00101768;
    }
    uStack_440 = (code *)0x101420;
    sender_pid = fork();
    pFVar11 = _stderr;
    if (sender_pid == -1) {
      if (err == true) {
        uStack_440 = (code *)0x10174f;
        puVar7 = (uint *)__errno_location();
        uVar6 = *puVar7;
        uStack_440 = (code *)0x10175a;
        pcVar8 = strerror(uVar6);
        pcVar10 = "Error in fork";
        goto LAB_00101768;
      }
LAB_0010148c:
      uStack_440 = (code *)0x101493;
      close(0);
      uStack_440 = (code *)0x1014a7;
      printf("PID: %d\n",(ulong)(uint)main_pid);
      puVar1 = (undefined1 *)((long)&tester_msg.total_processed + 2);
      while( true ) {
        if ((rcd_completed == '\x01') && (expected_rcd <= comm_summary.rcd)) {
          uStack_440 = (code *)0x1015df;
          tester_mq_finish(true,tester_mq,tester_mq_name,&err);
          pFVar11 = _stderr;
          if (err == true) {
            uStack_440 = (code *)0x1016f8;
            puVar7 = (uint *)__errno_location();
            uVar6 = *puVar7;
            uStack_440 = (code *)0x101703;
            pcVar8 = strerror(uVar6);
            pcVar10 = "Failed to finish tester mq in main process";
            goto LAB_0010167d;
          }
          tester_msg._1020_4_ = 0;
          uStack_440 = (code *)0x1015f8;
          _Var5 = wait(&tester_msg.field_0x3fc);
          if ((_Var5 == -1) || (tester_msg._1020_4_ != 0)) {
            err = true;
            uStack_440 = (code *)0x101626;
            log_formatted("Fail in %s, function: %s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                          ,"collect_sender");
          }
          pFVar11 = _stderr;
          if (err != true) {
            uStack_440 = (code *)0x101641;
            print_comm_summary(&comm_summary,false);
            return 0;
          }
          uStack_440 = (code *)0x101725;
          puVar7 = (uint *)__errno_location();
          uVar6 = *puVar7;
          uStack_440 = (code *)0x101730;
          pcVar8 = strerror(uVar6);
          pcVar10 = "Unexpected fail while collecting message sender";
          goto LAB_00101768;
        }
        uStack_440 = (code *)0x1014f1;
        tester_mq_receive(tester_mq,(tester_mq_msg *)local_438,&err);
        pFVar11 = _stderr;
        if (err == true) break;
        if ((char)tester_msg.total_processed == '\0') {
          comm_summary.rcd = comm_summary.rcd + 1;
          uStack_440 = (code *)0x101513;
          uVar6 = getpid();
          uStack_440 = (code *)0x10152d;
          log_formatted("%d RCD: %s, total rcd=%d",(ulong)uVar6,puVar1,comm_summary.rcd);
          pcVar8 = "%s N\n";
          if (tester_msg.total_processed._1_1_ == '\x01') {
            comm_summary.acc = comm_summary.acc + 1;
            pcVar8 = "%s A\n";
          }
          uStack_440 = (code *)0x101551;
          printf(pcVar8,puVar1);
        }
        if (local_438[0] == true) {
          uStack_440 = (code *)0x101563;
          uVar6 = getpid();
          uStack_440 = (code *)0x101573;
          log_formatted("%d RCD: COMPLETED",(ulong)uVar6);
          pVar2 = sender_pid;
          uStack_440 = (code *)0x10157f;
          iVar4 = __libc_current_sigrtmin();
          uStack_440 = (code *)0x10158a;
          kill(pVar2,iVar4 + 2);
          expected_rcd = tester_msg._0_8_;
          uStack_440 = (code *)0x1015b7;
          log_formatted("Expecting to wait for (%d-%d)=%d mode responses...",tester_msg._0_8_,
                        comm_summary.rcd,tester_msg._0_8_ - comm_summary.rcd);
          rcd_completed = '\x01';
        }
      }
      uStack_440 = (code *)0x101664;
      puVar7 = (uint *)__errno_location();
      uVar6 = *puVar7;
      uStack_440 = (code *)0x10166f;
      pcVar8 = strerror(uVar6);
      pcVar10 = "Failed to receive message from tester mq";
    }
    else {
      if (sender_pid != 0) goto LAB_0010148c;
      uStack_440 = (code *)0x101445;
      tester_mq_finish(false,tester_mq,(char *)0x0,&err);
      pFVar11 = _stderr;
      if (err == true) {
        uStack_440 = (code *)0x101461;
        puVar7 = (uint *)__errno_location();
        uVar6 = *puVar7;
        uStack_440 = (code *)0x10146c;
        pcVar8 = strerror(uVar6);
        pcVar10 = "Failed to finish tester mq in sender process";
      }
      else {
        uStack_440 = (code *)0x10178e;
        validator_mq = validator_mq_start(false,&err);
        pFVar11 = _stderr;
        if (err == true) {
          uStack_440 = (code *)0x1017ac;
          puVar7 = (uint *)__errno_location();
          uVar6 = *puVar7;
          uStack_440 = (code *)0x1017b7;
          pcVar8 = strerror(uVar6);
          pcVar10 = "Failed to start validator mq";
        }
        else {
          while( true ) {
            uStack_440 = (code *)0x1017ef;
            pcVar8 = fgets(local_438,0x3ea,_stdin);
            if (pcVar8 == (char *)0x0) break;
            uStack_440 = (code *)0x101800;
            sVar9 = strlen(local_438);
            local_438[sVar9 - 1] = '\0';
            _Var3 = local_438[0];
            halt = local_438[0] == true;
            uStack_440 = (code *)0x101822;
            uVar6 = getpid();
            uStack_440 = (code *)0x101837;
            log_formatted("%d SND: %s, start=%d, halt=%d",(ulong)uVar6,local_438,(ulong)!halt);
            validator_mq_send(validator_mq,!halt,halt,halt,false,false,main_pid,local_438,&err);
            pVar2 = main_pid;
            if (err != false) goto LAB_001018e2;
            if (_Var3 == true) goto LAB_0010190b;
            uStack_440 = (code *)0x10188a;
            iVar4 = __libc_current_sigrtmin();
            uStack_440 = (code *)0x101895;
            iVar4 = kill(pVar2,iVar4 + 1);
            if (iVar4 == -1) goto LAB_001018e2;
            local_438[0] = false;
          }
          validator_mq_send(validator_mq,false,false,true,false,false,main_pid,local_438,&err);
          if (err == true) {
LAB_001018e2:
            err = true;
            uStack_440 = (code *)0x101905;
            log_formatted("Fail in %s, function: %s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/tester.c"
                          ,"run_sender");
          }
LAB_0010190b:
          pFVar11 = _stderr;
          if ((err & 1U) == 0) {
            uStack_440 = (code *)0x101950;
            validator_mq_finish(false,validator_mq,&err);
            pFVar11 = _stderr;
            if (err != true) {
              uStack_440 = sig_err_handler;
              exit(0);
            }
            uStack_440 = (code *)0x101968;
            puVar7 = (uint *)__errno_location();
            uVar6 = *puVar7;
            uStack_440 = (code *)0x101973;
            pcVar8 = strerror(uVar6);
            pcVar10 = "Failed to finish validator mq";
          }
          else {
            uStack_440 = (code *)0x10191e;
            puVar7 = (uint *)__errno_location();
            uVar6 = *puVar7;
            uStack_440 = (code *)0x101929;
            pcVar8 = strerror(uVar6);
            pcVar10 = "Failed to read/send word to validator mq";
          }
        }
      }
    }
LAB_0010167d:
    uStack_440 = (code *)0x10168d;
    fprintf(pFVar11,"%s - error number: %d (%s)\n",pcVar10,(ulong)uVar6,pcVar8);
    uStack_440 = (code *)0x101692;
    err_sig_other_and_exit();
  }
  pFVar11 = _stderr;
  uStack_440 = (code *)0x1016a1;
  puVar7 = (uint *)__errno_location();
  uVar6 = *puVar7;
  uStack_440 = (code *)0x1016ac;
  pcVar8 = strerror(uVar6);
  pcVar10 = "Failed to set up signal handlers";
LAB_00101768:
  uStack_440 = (code *)0x101778;
  fprintf(pFVar11,"%s - error number: %d (%s)\n",pcVar10,(ulong)uVar6,pcVar8);
  uStack_440 = (code *)0x101780;
  exit(1);
}

Assistant:

int main() {
    assert(err == false);
    // initial setup
    main_pid = getpid();
    setup_sig_handlers(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to set up signal handlers");

    // setup queues
    tester_mq_get_name_from_pid(main_pid, tester_mq_name);
    tester_mq = tester_mq_start(true, tester_mq_name, &err);
    HANDLE_ERR_EXIT_WITH_MSG("Failed to start tester mq");

    // create process for processing and sending words
    async_spawn_sender();
    close(0); // prevent any possible data races in input

    printf("PID: %d\n", main_pid);
    // process validator responses
    tester_mq_msg tester_msg;
    while(!rcd_completed || comm_summary.rcd < expected_rcd) {
        tester_mq_receive(tester_mq, &tester_msg, &err);
        HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to receive message from tester mq");

        process_msg(&tester_msg);
    }
    tester_mq_finish(true, tester_mq, tester_mq_name, &err);
    HANDLE_ERR_WITH_MSG(err_sig_other_and_exit, "Failed to finish tester mq in main process");

    // clean up
    collect_sender(&err);
    HANDLE_ERR_EXIT_WITH_MSG("Unexpected fail while collecting message sender");
    print_comm_summary(&comm_summary, false);
    return 0;
}